

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.cpp
# Opt level: O2

int __thiscall crypto::arc4::init(arc4 *this,EVP_PKEY_CTX *ctx)

{
  uint8_t uVar1;
  size_t i;
  long lVar2;
  ulong uVar3;
  ulong in_RDX;
  size_t i_1;
  ulong uVar4;
  byte bVar5;
  uchar __tmp;
  
  this->a = 0;
  this->b = 0;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    this->state[lVar2] = (uint8_t)lVar2;
  }
  bVar5 = 0;
  uVar3 = 0x100;
  for (uVar4 = 0; uVar4 != 0x100; uVar4 = uVar4 + 1) {
    uVar1 = this->state[uVar4];
    bVar5 = bVar5 + uVar1 + (char)ctx[uVar4 % in_RDX];
    uVar3 = (ulong)bVar5;
    this->state[uVar4] = this->state[uVar3];
    this->state[uVar3] = uVar1;
  }
  return (int)uVar3;
}

Assistant:

void arc4::init(const char * key, size_t length) {
	
	a = b = 0;
	
	for(size_t i = 0; i < sizeof(state); i++){
		state[i] = boost::uint8_t(i);
	}
	
	size_t j = 0;
	for(size_t i = 0; i < sizeof(state); i++) {
		j = (j + state[i] + boost::uint8_t(key[i % length])) % sizeof(state);
		std::swap(state[i], state[j]);
	}
	
}